

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_chunk_test.cc
# Opt level: O0

vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
* __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::
CreateAndCollectFields<proto2_unittest::TestAllTypes,google::protobuf::compiler::cpp::(anonymous_namespace)::CollectFieldsTest_SingleChunk_Test::TestBody()::__0>
          (vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,Span<const_char_*> field_names,
          anon_class_1_0_00000001 *predicate)

{
  Options local_130;
  _anonymous_namespace_ *local_58;
  pointer ppcStack_50;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_40;
  Options *local_28;
  anon_class_1_0_00000001 *predicate_local;
  Span<const_char_*> field_names_local;
  
  local_28 = (Options *)field_names.len_;
  ppcStack_50 = field_names.ptr_;
  local_58 = this;
  predicate_local = (anon_class_1_0_00000001 *)this;
  field_names_local.ptr_ = ppcStack_50;
  field_names_local.len_ = (size_type)__return_storage_ptr__;
  cpp::anon_unknown_0::CreateFieldArray<proto2_unittest::TestAllTypes>
            (&local_40,(anon_unknown_0 *)this,field_names);
  local_130.access_info_map = (AccessInfoMap *)0x0;
  local_130.split_map = (SplitMap *)0x0;
  std::__cxx11::string::string((string *)&local_130.dllexport_decl);
  std::__cxx11::string::string((string *)&local_130.runtime_include_base);
  std::__cxx11::string::string((string *)&local_130.annotation_pragma_name);
  std::__cxx11::string::string((string *)&local_130.annotation_guard_name);
  local_130.field_listener_options.inject_field_listener_events = false;
  absl::lts_20250127::
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flat_hash_set(&local_130.field_listener_options.forbidden_field_listener_events);
  local_130.enforce_mode = kNoEnforcement;
  local_130.num_cc_files = 0;
  local_130.bounds_check_mode = kNoEnforcement;
  local_130.proto_h = false;
  local_130.transitive_pb_h = true;
  local_130.annotate_headers = false;
  local_130.lite_implicit_weak_fields = false;
  local_130.descriptor_implicit_weak_messages = false;
  local_130.bootstrap = false;
  local_130.opensource_runtime = false;
  local_130.annotate_accessor = false;
  local_130.force_split = false;
  local_130.force_eagerly_verified_lazy = false;
  local_130.force_inline_string = false;
  local_130.strip_nonfunctional_codegen = false;
  local_130.experimental_use_micro_string = protobuf::internal::EnableExperimentalMicroString();
  CollectFields<google::protobuf::compiler::cpp::(anonymous_namespace)::CollectFieldsTest_SingleChunk_Test::TestBody()::__0>
            (__return_storage_ptr__,(cpp *)&local_40,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&local_130,local_28,predicate);
  Options::~Options(&local_130);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<FieldChunk> CreateAndCollectFields(
    absl::Span<const char*> field_names, PredT&& predicate) {
  return CollectFields(CreateFieldArray<ProtoT>(field_names), {}, predicate);
}